

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

SRC_STATE * src_new(int converter_type,int channels,int *error)

{
  SRC_STATE *pSVar1;
  int *error_local;
  int channels_local;
  int converter_type_local;
  
  pSVar1 = psrc_set_converter(converter_type,channels,error);
  return pSVar1;
}

Assistant:

SRC_STATE *
src_new (int converter_type, int channels, int *error)
{
	return psrc_set_converter (converter_type, channels, error) ;
}